

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> * __thiscall
fmt::v10::detail::make_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,float>
          (basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>
           *__return_storage_ptr__,detail *this,float *val)

{
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *arg;
  float *val_local;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  longlong local_38;
  size_t local_30;
  
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::basic_format_arg
            (__return_storage_ptr__);
  __return_storage_ptr__->type_ = float_type;
  local_38._0_4_ = *(undefined4 *)this;
  (__return_storage_ptr__->value_).field_0.long_long_value = local_38;
  (__return_storage_ptr__->value_).field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto make_arg(T& val) -> basic_format_arg<Context> {
  auto arg = basic_format_arg<Context>();
  arg.type_ = mapped_type_constant<T, Context>::value;
  arg.value_ = make_arg<true, Context>(val);
  return arg;
}